

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldClear
          (MessageGenerator *this,FieldDescriptor *field,bool is_inline,Printer *p)

{
  long lVar1;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  allocator<char> local_23a;
  allocator<char> local_239;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  Printer *p_local;
  FieldDescriptor *field_local;
  _Any_data local_208;
  code *local_1f8;
  code *pcStack_1f0;
  char *local_1e0;
  string local_1d8;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  field_local = field;
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)&local_1a0,field,&this->options_);
  vars.len_ = (long)(local_1a0.key_._M_string_length - (long)local_1a0.key_._M_dataplus._M_p) / 0xb8
  ;
  vars.ptr_ = (pointer)local_1a0.key_._M_dataplus._M_p;
  io::Printer::WithVars(&t,p,vars);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"inline",&local_239);
  local_1e0 = anon_var_dwarf_651463 + 5;
  if (is_inline) {
    local_1e0 = "inline";
  }
  io::Printer::Sub::Sub<char_const*>(&local_1a0,&local_1d8,&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"body",&local_23a);
  local_e8 = local_d8;
  if (local_238 == local_228) {
    uStack_d0 = uStack_220;
  }
  else {
    local_e8 = local_238;
  }
  local_e0 = local_230;
  local_230 = 0;
  local_228[0] = 0;
  local_1f8 = (code *)0x0;
  pcStack_1f0 = (code *)0x0;
  local_208._M_unused._M_object = (void *)0x0;
  local_208._8_8_ = 0;
  local_238 = local_228;
  local_208._M_unused._M_object = operator_new(0x20);
  *(FieldDescriptor ***)local_208._M_unused._0_8_ = &field_local;
  *(Printer ***)((long)local_208._M_unused._0_8_ + 8) = &p_local;
  *(MessageGenerator **)((long)local_208._M_unused._0_8_ + 0x10) = this;
  *(code *)((long)local_208._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_1f0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_1f8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_208);
  std::_Function_base::~_Function_base((_Function_base *)&local_208);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  io::Printer::Emit(p,&local_1a0,2,0xd7,
                    "\n            $inline $void $classname$::clear_$name$() {\n              $pbi$::TSanWrite(&_impl_);\n              $WeakDescriptorSelfPin$;\n              $body$;\n              $annotate_clear$;\n            }\n          "
                   );
  lVar1 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_1a0.key_._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != -0xb8);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1d8);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&t);
  return;
}

Assistant:

void MessageGenerator::GenerateFieldClear(const FieldDescriptor* field,
                                          bool is_inline, io::Printer* p) {
  auto t = p->WithVars(MakeTrackerCalls(field, options_));
  p->Emit({{"inline", is_inline ? "inline" : ""},
           {"body",
            [&] {
              if (field->real_containing_oneof()) {
                // Clear this field only if it is the active field in this
                // oneof, otherwise ignore
                p->Emit(
                    {{"clearing_code",
                      [&] {
                        field_generators_.get(field).GenerateClearingCode(p);
                      }}},
                    R"cc(
                      if ($has_field$) {
                        $clearing_code$;
                        clear_has_$oneof_name$();
                      }
                    )cc");
              } else {
                // TODO: figure out if early return breaks tracking
                if (ShouldSplit(field, options_)) {
                  p->Emit(R"cc(
                    if (ABSL_PREDICT_TRUE(IsSplitMessageDefault()))
                      return;
                  )cc");
                }
                field_generators_.get(field).GenerateClearingCode(p);
                if (HasHasbit(field)) {
                  auto v = p->WithVars(HasBitVars(field));
                  p->Emit(R"cc(
                    $has_bits$[$has_array_index$] &= ~$has_mask$;
                  )cc");
                }
              }
            }}},
          R"cc(
            $inline $void $classname$::clear_$name$() {
              $pbi$::TSanWrite(&_impl_);
              $WeakDescriptorSelfPin$;
              $body$;
              $annotate_clear$;
            }
          )cc");
}